

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleDownloadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  undefined1 auVar4 [8];
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  CURLcode CVar8;
  long lVar9;
  long lVar10;
  ostream *poVar11;
  cURLEasyGuard *this_00;
  undefined8 *puVar12;
  char *pcVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  undefined1 auVar15 [8];
  pointer pbVar16;
  ulong uVar17;
  string err_1;
  cURLProgressHelper helper;
  string actualHash_1;
  string expectedHash;
  string file;
  string dir;
  cmFileCommandVectorOfChar chunkDebug;
  string hashMatchMSG;
  string statusVar;
  string logVar;
  ofstream fout;
  string url;
  bool local_551;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_550;
  long local_548;
  undefined1 local_540 [8];
  char *local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530 [6];
  ios_base local_4d0 [264];
  undefined1 local_3c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  string local_398;
  char *local_378;
  cmFileCommand *local_370;
  char local_368;
  undefined7 uStack_367;
  string local_358;
  string local_338;
  vector<char,_std::allocator<char>_> local_318;
  char *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  undefined1 local_2e8;
  undefined7 uStack_2e7;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [8];
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  byte abStack_278 [80];
  ios_base local_228 [136];
  ios_base local_1a0 [264];
  long *local_98 [2];
  long local_88 [2];
  ulong local_78;
  string local_70;
  string local_50;
  
  pbVar16 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16) < 0x41) {
    local_298 = (undefined1  [8])&local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"DOWNLOAD must be called with at least three arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_298);
    if (local_298 != (undefined1  [8])&local_288) {
      operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
    }
    return false;
  }
  local_98[0] = local_88;
  pcVar2 = pbVar16[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar2,pcVar2 + pbVar16[1]._M_string_length);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  pcVar2 = pbVar16[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_358,pcVar2,pcVar2 + pbVar16[2]._M_string_length);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  pcVar3 = (this->super_cmCommand).Makefile;
  local_298 = (undefined1  [8])&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_TLS_VERIFY","");
  local_551 = cmMakefile::IsOn(pcVar3,(string *)local_298);
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCommand).Makefile;
  local_298 = (undefined1  [8])&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_TLS_CAINFO","");
  local_300 = cmMakefile::GetDefinition(pcVar3,(string *)local_298);
  pbVar16 = pbVar16 + 3;
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
  }
  local_378 = &local_368;
  lVar10 = 0;
  local_370 = (cmFileCommand *)0x0;
  uVar17 = 0;
  local_368 = '\0';
  local_2f8 = &local_2e8;
  local_2f0 = (char *)0x0;
  local_2e8 = 0;
  if (pbVar16 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_550 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_548 = 0;
  }
  else {
    local_548 = 0;
    lVar10 = 0;
    uVar17 = 0;
    local_550 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    do {
      iVar7 = std::__cxx11::string::compare((char *)pbVar16);
      if (iVar7 == 0) {
        pbVar16 = pbVar16 + 1;
        if (pbVar16 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          local_298 = (undefined1  [8])&local_288;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"DOWNLOAD missing time for TIMEOUT.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_298);
          goto LAB_002745d2;
        }
        local_548 = atol((pbVar16->_M_dataplus)._M_p);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)pbVar16);
        if (iVar7 == 0) {
          pbVar16 = pbVar16 + 1;
          if (pbVar16 ==
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_298 = (undefined1  [8])&local_288;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_298,"DOWNLOAD missing time for INACTIVITY_TIMEOUT.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_298);
            goto LAB_002745d2;
          }
          lVar10 = atol((pbVar16->_M_dataplus)._M_p);
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)pbVar16);
          if (iVar7 == 0) {
            pbVar16 = pbVar16 + 1;
            if (pbVar16 ==
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              local_298 = (undefined1  [8])&local_288;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_298,"DOWNLOAD missing VAR for LOG.","");
              cmCommand::SetError(&this->super_cmCommand,(string *)local_298);
              goto LAB_002745d2;
            }
            std::__cxx11::string::_M_assign((string *)&local_2b8);
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)pbVar16);
            if (iVar7 == 0) {
              pbVar16 = pbVar16 + 1;
              if (pbVar16 ==
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
                local_298 = (undefined1  [8])&local_288;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_298,"DOWNLOAD missing VAR for STATUS.","");
                cmCommand::SetError(&this->super_cmCommand,(string *)local_298);
                goto LAB_002745d2;
              }
              std::__cxx11::string::_M_assign((string *)&local_2d8);
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)pbVar16);
              if (iVar7 == 0) {
                pbVar16 = pbVar16 + 1;
                if (pbVar16 ==
                    (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
                  local_298 = (undefined1  [8])&local_288;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_298,"TLS_VERIFY missing bool value.","");
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_298);
                  goto LAB_002745d2;
                }
                local_551 = cmSystemTools::IsOn((pbVar16->_M_dataplus)._M_p);
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)pbVar16);
                if (iVar7 == 0) {
                  pbVar16 = pbVar16 + 1;
                  if (pbVar16 ==
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
                    local_298 = (undefined1  [8])&local_288;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_298,"TLS_CAFILE missing file value.","");
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_298);
                    goto LAB_002745d2;
                  }
                  local_300 = (pbVar16->_M_dataplus)._M_p;
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)pbVar16);
                  if (iVar7 == 0) {
                    pbVar16 = pbVar16 + 1;
                    if (pbVar16 ==
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish) {
                      local_298 = (undefined1  [8])&local_288;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_298,"DOWNLOAD missing sum value for EXPECTED_MD5.",
                                 "");
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_298);
                      goto LAB_002745d2;
                    }
                    cmCryptoHash::New((cmCryptoHash *)local_298,"MD5");
                    auVar4 = local_298;
                    local_298 = (undefined1  [8])0x0;
                    if ((undefined1  [8])local_550 != auVar4) {
                      if ((local_550 !=
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0) &&
                         ((**(code **)(local_550->_M_allocated_capacity + 8))(),
                         local_298 != (undefined1  [8])0x0)) {
                        (**(code **)(*(size_type *)local_298 + 8))();
                      }
                      local_550 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)auVar4;
                    }
                    std::__cxx11::string::_M_replace((ulong)&local_2f8,0,local_2f0,0x4b6ff0);
                    cmsys::SystemTools::LowerCase((string *)local_298,pbVar16);
                    std::__cxx11::string::operator=((string *)&local_378,(string *)local_298);
                    if (local_298 != (undefined1  [8])&local_288) {
                      operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
                    }
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare((char *)pbVar16);
                    if (iVar7 == 0) {
                      uVar17 = CONCAT71((int7)(uVar17 >> 8),1);
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare((char *)pbVar16);
                      if (iVar7 == 0) {
                        pbVar1 = pbVar16 + 1;
                        if (pbVar1 == (args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish) {
                          local_298 = (undefined1  [8])&local_288;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_298,
                                     "DOWNLOAD missing ALGO=value for EXPECTED_HASH.","");
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_298);
                        }
                        else {
                          local_78 = uVar17;
                          lVar9 = std::__cxx11::string::find((char *)pbVar1,0x4da3ae,0);
                          if (lVar9 != -1) {
                            std::__cxx11::string::substr((ulong)local_298,(ulong)pbVar1);
                            std::__cxx11::string::substr((ulong)local_3c8,(ulong)pbVar1);
                            cmsys::SystemTools::LowerCase((string *)local_540,(string *)local_3c8);
                            std::__cxx11::string::operator=
                                      ((string *)&local_378,(string *)local_540);
                            if (local_540 != (undefined1  [8])local_530) {
                              operator_delete((void *)local_540,
                                              CONCAT71(local_530[0]._M_allocated_capacity._1_7_,
                                                       local_530[0]._M_local_buf[0]) + 1);
                            }
                            if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
                              operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
                            }
                            cmCryptoHash::New((cmCryptoHash *)local_540,(char *)local_298);
                            auVar4 = local_540;
                            local_540 = (undefined1  [8])0x0;
                            auVar15 = (undefined1  [8])local_550;
                            if ((((undefined1  [8])local_550 != auVar4) &&
                                (auVar15 = auVar4,
                                local_550 !=
                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x0)) &&
                               ((**(code **)(local_550->_M_allocated_capacity + 8))(),
                               local_540 != (undefined1  [8])0x0)) {
                              (**(code **)(*(size_type *)local_540 + 8))();
                            }
                            uVar17 = local_78;
                            if (auVar15 == (undefined1  [8])0x0) {
                              local_540 = (undefined1  [8])local_530;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_540,
                                         "DOWNLOAD EXPECTED_HASH given unknown ALGO: ","");
                              std::__cxx11::string::_M_append((char *)local_540,(ulong)local_298);
                              cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
                            }
                            else {
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_540,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_298," hash");
                              std::__cxx11::string::operator=
                                        ((string *)&local_2f8,(string *)local_540);
                            }
                            if (local_540 != (undefined1  [8])local_530) {
                              operator_delete((void *)local_540,
                                              CONCAT71(local_530[0]._M_allocated_capacity._1_7_,
                                                       local_530[0]._M_local_buf[0]) + 1);
                            }
                            if (local_298 != (undefined1  [8])&local_288) {
                              operator_delete((void *)local_298,local_288._M_allocated_capacity + 1)
                              ;
                            }
                            pbVar16 = pbVar1;
                            local_550 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)auVar15;
                            if (auVar15 != (undefined1  [8])0x0) goto LAB_00273bcb;
                            bVar6 = false;
                            goto LAB_002746ec;
                          }
                          local_298 = (undefined1  [8])&local_288;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_298,
                                     "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ","");
                          std::__cxx11::string::_M_append
                                    (local_298,(ulong)pbVar16[1]._M_dataplus._M_p);
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_298);
                        }
LAB_002745d2:
                        if (local_298 != (undefined1  [8])&local_288) {
                          operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
                        }
                        bVar6 = false;
                        goto LAB_002746dc;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00273bcb:
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar6 = cmsys::SystemTools::FileExists(local_358._M_dataplus._M_p);
  if (bVar6 && local_550 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) {
    local_538 = (char *)0x0;
    local_530[0]._M_local_buf[0] = '\0';
    local_540 = (undefined1  [8])local_530;
    cmCryptoHash::HashFile
              ((string *)local_3c8,(cmCryptoHash *)&local_550->_M_allocated_capacity,&local_358);
    uVar5 = local_3c8._0_8_;
    if (((cmFileCommand *)local_3c8._8_8_ != local_370) ||
       (((cmFileCommand *)local_3c8._8_8_ != (cmFileCommand *)0x0 &&
        (iVar7 = bcmp((void *)local_3c8._0_8_,local_378,local_3c8._8_8_), iVar7 != 0)))) {
      if ((undefined1 *)uVar5 != local_3c8 + 0x10) {
        operator_delete((void *)uVar5,local_3c8._16_8_ + 1);
      }
      if (local_540 != (undefined1  [8])local_530) {
        operator_delete((void *)local_540,
                        CONCAT71(local_530[0]._M_allocated_capacity._1_7_,
                                 local_530[0]._M_local_buf[0]) + 1);
      }
      goto LAB_00274015;
    }
    std::__cxx11::string::_M_replace((ulong)local_540,0,local_538,0x4b70a9);
    std::__cxx11::string::_M_append(local_540,(ulong)local_2f8);
    std::__cxx11::string::append(local_540);
    if (local_2d8._M_string_length != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
      poVar11 = (ostream *)std::ostream::operator<<(local_298,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\"",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_540,(long)local_538);
      pcVar3 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::AddDefinition(pcVar3,&local_2d8,local_338._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
      std::ios_base::~ios_base(local_228);
    }
    if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
      operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
    }
    if (local_540 != (undefined1  [8])local_530) {
      operator_delete((void *)local_540,
                      CONCAT71(local_530[0]._M_allocated_capacity._1_7_,local_530[0]._M_local_buf[0]
                              ) + 1);
    }
    bVar6 = true;
  }
  else {
LAB_00274015:
    cmsys::SystemTools::GetFilenamePath(&local_338,&local_358);
    bVar6 = cmsys::SystemTools::FileExists(local_338._M_dataplus._M_p);
    if ((bVar6) || (bVar6 = cmsys::SystemTools::MakeDirectory(local_338._M_dataplus._M_p), bVar6)) {
      std::ofstream::ofstream(local_298,local_358._M_dataplus._M_p,_S_bin);
      if ((abStack_278[*(long *)((long)local_298 + -0x18)] & 5) == 0) {
        curl_global_init(3);
        this_00 = (cURLEasyGuard *)curl_easy_init();
        if (this_00 == (cURLEasyGuard *)0x0) {
          local_540 = (undefined1  [8])local_530;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_540,"DOWNLOAD error initializing curl.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
          goto LAB_002740b0;
        }
        CVar8 = curl_easy_setopt(this_00,CURLOPT_URL,local_98[0]);
        if (CVar8 == CURLE_OK) {
          CVar8 = curl_easy_setopt(this_00,CURLOPT_FAILONERROR,1);
          if (CVar8 != CURLE_OK) {
            local_540 = (undefined1  [8])local_530;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_540,"DOWNLOAD cannot set http failure option: ","");
            curl_easy_strerror(CVar8);
            std::__cxx11::string::append(local_540);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
            goto LAB_00274662;
          }
          CVar8 = curl_easy_setopt(this_00,CURLOPT_USERAGENT,"curl/7.38.0");
          if (CVar8 != CURLE_OK) {
            local_540 = (undefined1  [8])local_530;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_540,"DOWNLOAD cannot set user agent option: ","");
            curl_easy_strerror(CVar8);
            std::__cxx11::string::append(local_540);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
            goto LAB_00274662;
          }
          CVar8 = curl_easy_setopt(this_00,CURLOPT_WRITEFUNCTION,
                                   anon_unknown.dwarf_25fa30::cmWriteToFileCallback);
          if (CVar8 != CURLE_OK) {
            local_540 = (undefined1  [8])local_530;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_540,"DOWNLOAD cannot set write function: ","");
            curl_easy_strerror(CVar8);
            std::__cxx11::string::append(local_540);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
            goto LAB_00274662;
          }
          CVar8 = curl_easy_setopt(this_00,CURLOPT_DEBUGFUNCTION,
                                   anon_unknown.dwarf_25fa30::cmFileCommandCurlDebugCallback);
          if (CVar8 != CURLE_OK) {
            local_540 = (undefined1  [8])local_530;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_540,"DOWNLOAD cannot set debug function: ","");
            curl_easy_strerror(CVar8);
            std::__cxx11::string::append(local_540);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
            goto LAB_00274662;
          }
          if (local_551 == false) {
            CVar8 = curl_easy_setopt(this_00,CURLOPT_SSL_VERIFYPEER,0);
            if (CVar8 == CURLE_OK) goto LAB_002748ac;
            local_540 = (undefined1  [8])local_530;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_540,"Unable to set TLS/SSL Verify off: ","");
            curl_easy_strerror(CVar8);
            std::__cxx11::string::append(local_540);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
            goto LAB_00274662;
          }
          CVar8 = curl_easy_setopt(this_00,CURLOPT_SSL_VERIFYPEER,1);
          if (CVar8 != CURLE_OK) {
            local_540 = (undefined1  [8])local_530;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_540,"Unable to set TLS/SSL Verify on: ","");
            curl_easy_strerror(CVar8);
            std::__cxx11::string::append(local_540);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
            goto LAB_00274662;
          }
LAB_002748ac:
          cmCurlSetCAInfo_abi_cxx11_(&local_70,this_00,local_300);
          if (local_70._M_string_length == 0) {
            local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (char *)0x0;
            local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            CVar8 = curl_easy_setopt(this_00,CURLOPT_WRITEDATA,local_298);
            if (CVar8 == CURLE_OK) {
              CVar8 = curl_easy_setopt(this_00,CURLOPT_DEBUGDATA,&local_318);
              if (CVar8 != CURLE_OK) {
                local_540 = (undefined1  [8])local_530;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_540,"DOWNLOAD cannot set debug data: ","");
                curl_easy_strerror(CVar8);
                std::__cxx11::string::append(local_540);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
                goto LAB_00274a2a;
              }
              CVar8 = curl_easy_setopt(this_00,CURLOPT_FOLLOWLOCATION,1);
              if (CVar8 != CURLE_OK) {
                local_540 = (undefined1  [8])local_530;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_540,"DOWNLOAD cannot set follow-redirect option: ","");
                curl_easy_strerror(CVar8);
                std::__cxx11::string::append(local_540);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
                goto LAB_00274a2a;
              }
              if ((local_2b8._M_string_length != 0) &&
                 (CVar8 = curl_easy_setopt(this_00,CURLOPT_VERBOSE,1), CVar8 != CURLE_OK)) {
                local_540 = (undefined1  [8])local_530;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_540,"DOWNLOAD cannot set verbose: ","");
                curl_easy_strerror(CVar8);
                std::__cxx11::string::append(local_540);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
                goto LAB_00274a2a;
              }
              if ((0 < local_548) &&
                 (CVar8 = curl_easy_setopt(this_00,CURLOPT_TIMEOUT,local_548), CVar8 != CURLE_OK)) {
                local_540 = (undefined1  [8])local_530;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_540,"DOWNLOAD cannot set timeout: ","");
                curl_easy_strerror(CVar8);
                std::__cxx11::string::append(local_540);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
                goto LAB_00274a2a;
              }
              if (0 < lVar10) {
                curl_easy_setopt(this_00,CURLOPT_LOW_SPEED_LIMIT,1);
                curl_easy_setopt(this_00,CURLOPT_LOW_SPEED_TIME,lVar10);
              }
              anon_unknown.dwarf_25fa30::cURLProgressHelper::cURLProgressHelper
                        ((cURLProgressHelper *)local_3c8,this,"download");
              if ((uVar17 & 1) == 0) {
LAB_00274cf4:
                CVar8 = curl_easy_perform(this_00);
                curl_easy_cleanup(this_00);
                if (local_2d8._M_string_length != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_540);
                  poVar11 = (ostream *)std::ostream::operator<<(local_540,CVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\"",2);
                  pcVar13 = curl_easy_strerror(CVar8);
                  poVar11 = std::operator<<(poVar11,pcVar13);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
                  pcVar3 = (this->super_cmCommand).Makefile;
                  std::__cxx11::stringbuf::str();
                  cmMakefile::AddDefinition(pcVar3,&local_2d8,local_398._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._M_dataplus._M_p != &local_398.field_2) {
                    operator_delete(local_398._M_dataplus._M_p,
                                    local_398.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_540);
                  std::ios_base::~ios_base(local_4d0);
                }
                curl_global_cleanup();
                std::ostream::flush();
                std::ofstream::close();
                if (local_550 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  cmCryptoHash::HashFile
                            (&local_398,(cmCryptoHash *)&local_550->_M_allocated_capacity,&local_358
                            );
                  if ((cmFileCommand *)local_398._M_string_length == (cmFileCommand *)0x0) {
                    local_540 = (undefined1  [8])local_530;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_540,"DOWNLOAD cannot compute hash on downloaded file"
                               ,"");
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
                    if (local_540 != (undefined1  [8])local_530) {
                      operator_delete((void *)local_540,
                                      CONCAT71(local_530[0]._M_allocated_capacity._1_7_,
                                               local_530[0]._M_local_buf[0]) + 1);
                    }
LAB_0027508c:
                    bVar6 = false;
                  }
                  else {
                    if ((local_370 != (cmFileCommand *)local_398._M_string_length) ||
                       (iVar7 = bcmp(local_378,local_398._M_dataplus._M_p,local_398._M_string_length
                                    ), iVar7 != 0)) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_540);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_540,"DOWNLOAD HASH mismatch",0x16);
                      poVar11 = std::endl<char,std::char_traits<char>>((ostream *)local_540);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,"  for file: [",0xd);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar11,local_358._M_dataplus._M_p,
                                           local_358._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
                      poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,"    expected hash: [",0x14);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar11,local_378,(long)local_370);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
                      poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,"      actual hash: [",0x14);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar11,local_398._M_dataplus._M_p,
                                           local_398._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
                      poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,"           status: [",0x14);
                      poVar11 = (ostream *)std::ostream::operator<<(poVar11,CVar8);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\"",2);
                      pcVar13 = curl_easy_strerror(CVar8);
                      poVar11 = std::operator<<(poVar11,pcVar13);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"]",2);
                      std::endl<char,std::char_traits<char>>(poVar11);
                      std::__cxx11::stringbuf::str();
                      cmCommand::SetError(&this->super_cmCommand,&local_50);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                        operator_delete(local_50._M_dataplus._M_p,
                                        local_50.field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_540);
                      std::ios_base::~ios_base(local_4d0);
                      goto LAB_0027508c;
                    }
                    bVar6 = true;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._M_dataplus._M_p != &local_398.field_2) {
                    operator_delete(local_398._M_dataplus._M_p,
                                    local_398.field_2._M_allocated_capacity + 1);
                  }
                  if (!bVar6) {
                    this_00 = (cURLEasyGuard *)0x0;
                    goto LAB_002750fb;
                  }
                }
                bVar6 = true;
                if (local_2b8._M_string_length != 0) {
                  local_540 = (undefined1  [8])((ulong)local_540 & 0xffffffffffffff00);
                  std::vector<char,_std::allocator<char>_>::push_back(&local_318,local_540);
                  cmMakefile::AddDefinition
                            ((this->super_cmCommand).Makefile,&local_2b8,
                             local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
                }
                this_00 = (cURLEasyGuard *)0x0;
              }
              else {
                CVar8 = curl_easy_setopt(this_00,CURLOPT_NOPROGRESS,0);
                if (CVar8 == CURLE_OK) {
                  CVar8 = curl_easy_setopt(this_00,CURLOPT_PROGRESSFUNCTION,
                                           anon_unknown.dwarf_25fa30::cmFileDownloadProgressCallback
                                          );
                  if (CVar8 == CURLE_OK) {
                    CVar8 = curl_easy_setopt(this_00,CURLOPT_PROGRESSDATA,local_3c8);
                    if (CVar8 == CURLE_OK) goto LAB_00274cf4;
                    local_540 = (undefined1  [8])local_530;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_540,"DOWNLOAD cannot set progress data: ","");
                    curl_easy_strerror(CVar8);
                    std::__cxx11::string::append(local_540);
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
                  }
                  else {
                    local_540 = (undefined1  [8])local_530;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_540,"DOWNLOAD cannot set progress function: ","");
                    curl_easy_strerror(CVar8);
                    std::__cxx11::string::append(local_540);
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
                  }
                }
                else {
                  local_540 = (undefined1  [8])local_530;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_540,"DOWNLOAD cannot set noprogress value: ","");
                  curl_easy_strerror(CVar8);
                  std::__cxx11::string::append(local_540);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
                }
                if (local_540 != (undefined1  [8])local_530) {
                  operator_delete((void *)local_540,
                                  CONCAT71(local_530[0]._M_allocated_capacity._1_7_,
                                           local_530[0]._M_local_buf[0]) + 1);
                }
LAB_002750fb:
                bVar6 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._16_8_ != &local_3a8) {
                operator_delete((void *)local_3c8._16_8_,local_3a8._M_allocated_capacity + 1);
              }
            }
            else {
              local_540 = (undefined1  [8])local_530;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_540,"DOWNLOAD cannot set write data: ","");
              curl_easy_strerror(CVar8);
              std::__cxx11::string::append(local_540);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
LAB_00274a2a:
              if (local_540 != (undefined1  [8])local_530) {
                operator_delete((void *)local_540,
                                CONCAT71(local_530[0]._M_allocated_capacity._1_7_,
                                         local_530[0]._M_local_buf[0]) + 1);
              }
              bVar6 = false;
            }
            if (local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != (char *)0x0) {
              operator_delete(local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_318.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_318.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            cmCommand::SetError(&this->super_cmCommand,&local_70);
            bVar6 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_540 = (undefined1  [8])local_530;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_540,"DOWNLOAD cannot set url: ","");
          curl_easy_strerror(CVar8);
          std::__cxx11::string::append(local_540);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
LAB_00274662:
          if (local_540 != (undefined1  [8])local_530) {
            operator_delete((void *)local_540,
                            CONCAT71(local_530[0]._M_allocated_capacity._1_7_,
                                     local_530[0]._M_local_buf[0]) + 1);
          }
          bVar6 = false;
        }
        anon_unknown.dwarf_25fa30::cURLEasyGuard::~cURLEasyGuard(this_00);
      }
      else {
        local_540 = (undefined1  [8])local_530;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_540,"DOWNLOAD cannot open file for write.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_540);
LAB_002740b0:
        if (local_540 != (undefined1  [8])local_530) {
          operator_delete((void *)local_540,
                          CONCAT71(local_530[0]._M_allocated_capacity._1_7_,
                                   local_530[0]._M_local_buf[0]) + 1);
        }
        bVar6 = false;
      }
      local_298 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_298 + (&_VTT->_M_allocated_capacity)[-3]) = _getsockopt;
      std::filebuf::~filebuf((filebuf *)&local_290);
      std::ios_base::~ios_base(local_1a0);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540,
                     "DOWNLOAD error: cannot create directory \'",&local_338);
      puVar12 = (undefined8 *)std::__cxx11::string::append(local_540);
      local_298 = (undefined1  [8])&local_288;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 == paVar14) {
        local_288._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_288._8_8_ = puVar12[3];
      }
      else {
        local_288._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_298 = (undefined1  [8])*puVar12;
      }
      local_290 = puVar12[1];
      *puVar12 = paVar14;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      if (local_540 != (undefined1  [8])local_530) {
        operator_delete((void *)local_540,
                        CONCAT71(local_530[0]._M_allocated_capacity._1_7_,
                                 local_530[0]._M_local_buf[0]) + 1);
      }
      cmCommand::SetError(&this->super_cmCommand,(string *)local_298);
      if (local_298 != (undefined1  [8])&local_288) {
        operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
      }
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
LAB_002746dc:
    if (local_550 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_002746ec;
  }
  (**(code **)(local_550->_M_allocated_capacity + 8))();
LAB_002746ec:
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,CONCAT71(uStack_2e7,local_2e8) + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,CONCAT71(uStack_367,local_368) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,
                    CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                             local_2d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                             local_2b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  return bVar6;
}

Assistant:

bool
cmFileCommand::HandleDownloadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::vector<std::string>::const_iterator i = args.begin();
  if(args.size() < 3)
    {
    this->SetError("DOWNLOAD must be called with at least three arguments.");
    return false;
    }
  ++i; // Get rid of subcommand
  std::string url = *i;
  ++i;
  std::string file = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool tls_verify = this->Makefile->IsOn("CMAKE_TLS_VERIFY");
  const char* cainfo = this->Makefile->GetDefinition("CMAKE_TLS_CAINFO");
  std::string expectedHash;
  std::string hashMatchMSG;
  cmsys::auto_ptr<cmCryptoHash> hash;
  bool showProgress = false;

  while(i != args.end())
    {
    if(*i == "TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("DOWNLOAD missing time for TIMEOUT.");
        return false;
        }
      }
    else if(*i == "INACTIVITY_TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        inactivity_timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("DOWNLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
        }
      }
    else if(*i == "LOG")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("DOWNLOAD missing VAR for LOG.");
        return false;
        }
      logVar = *i;
      }
    else if(*i == "STATUS")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("DOWNLOAD missing VAR for STATUS.");
        return false;
        }
      statusVar = *i;
      }
    else if(*i == "TLS_VERIFY")
      {
      ++i;
      if(i != args.end())
        {
        tls_verify = cmSystemTools::IsOn(i->c_str());
        }
      else
        {
        this->SetError("TLS_VERIFY missing bool value.");
        return false;
        }
      }
    else if(*i == "TLS_CAINFO")
      {
      ++i;
      if(i != args.end())
        {
        cainfo = i->c_str();
        }
      else
        {
        this->SetError("TLS_CAFILE missing file value.");
        return false;
        }
      }
    else if(*i == "EXPECTED_MD5")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("DOWNLOAD missing sum value for EXPECTED_MD5.");
        return false;
        }
      hash = cmsys::auto_ptr<cmCryptoHash>(cmCryptoHash::New("MD5"));
      hashMatchMSG = "MD5 sum";
      expectedHash = cmSystemTools::LowerCase(*i);
      }
    else if(*i == "SHOW_PROGRESS")
      {
      showProgress = true;
      }
    else if(*i == "EXPECTED_HASH")
      {
      ++i;
      if(i == args.end())
        {
        this->SetError("DOWNLOAD missing ALGO=value for EXPECTED_HASH.");
        return false;
        }
      std::string::size_type pos = i->find("=");
      if(pos == std::string::npos)
        {
        std::string err =
          "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ";
        err += *i;
        this->SetError(err);
        return false;
        }
      std::string algo = i->substr(0, pos);
      expectedHash = cmSystemTools::LowerCase(i->substr(pos+1));
      hash = cmsys::auto_ptr<cmCryptoHash>(cmCryptoHash::New(algo.c_str()));
      if(!hash.get())
        {
        std::string err = "DOWNLOAD EXPECTED_HASH given unknown ALGO: ";
        err += algo;
        this->SetError(err);
        return false;
        }
      hashMatchMSG = algo + " hash";
      }
    ++i;
    }
  // If file exists already, and caller specified an expected md5 or sha,
  // and the existing file already has the expected hash, then simply
  // return.
  //
  if(cmSystemTools::FileExists(file.c_str()) && hash.get())
    {
    std::string msg;
    std::string actualHash = hash->HashFile(file);
    if(actualHash == expectedHash)
      {
      msg = "returning early; file already exists with expected ";
      msg += hashMatchMSG;
      msg += "\"";
      if(!statusVar.empty())
        {
        std::ostringstream result;
        result << (int)0 << ";\"" << msg;
        this->Makefile->AddDefinition(statusVar,
                                      result.str().c_str());
        }
      return true;
      }
    }
  // Make sure parent directory exists so we can write to the file
  // as we receive downloaded bits from curl...
  //
  std::string dir = cmSystemTools::GetFilenamePath(file);
  if(!cmSystemTools::FileExists(dir.c_str()) &&
     !cmSystemTools::MakeDirectory(dir.c_str()))
    {
    std::string errstring = "DOWNLOAD error: cannot create directory '"
      + dir + "' - Specify file by full path name and verify that you "
      "have directory creation and file write privileges.";
    this->SetError(errstring);
    return false;
    }

  cmsys::ofstream fout(file.c_str(), std::ios::binary);
  if(!fout)
    {
    this->SetError("DOWNLOAD cannot open file for write.");
    return false;
    }

#if defined(_WIN32) && defined(CMAKE_ENCODING_UTF8)
  url = fix_file_url_windows(url);
#endif

  ::CURL *curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if(!curl)
    {
    this->SetError("DOWNLOAD error initializing curl.");
    return false;
    }

  cURLEasyGuard g_curl(curl);
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "DOWNLOAD cannot set url: ");

  // enable HTTP ERROR parsing
  res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "DOWNLOAD cannot set http failure option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_USERAGENT, "curl/" LIBCURL_VERSION);
  check_curl_result(res, "DOWNLOAD cannot set user agent option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                           cmWriteToFileCallback);
  check_curl_result(res, "DOWNLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "DOWNLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if(tls_verify)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "Unable to set TLS/SSL Verify on: ");
    }
  else
    {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "Unable to set TLS/SSL Verify off: ");
    }
  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty())
    {
    this->SetError(cainfo_err);
    return false;
    }

  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *)&fout);
  check_curl_result(res, "DOWNLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, (void *)&chunkDebug);
  check_curl_result(res, "DOWNLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "DOWNLOAD cannot set follow-redirect option: ");

  if(!logVar.empty())
    {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "DOWNLOAD cannot set verbose: ");
    }

  if(timeout > 0)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout );
    check_curl_result(res, "DOWNLOAD cannot set timeout: ");
    }

  if(inactivity_timeout > 0)
    {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
    }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "download");

  if(showProgress)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "DOWNLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSFUNCTION, cmFileDownloadProgressCallback);
    check_curl_result(res, "DOWNLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSDATA, reinterpret_cast<void*>(&helper));
    check_curl_result(res, "DOWNLOAD cannot set progress data: ");
    }

  res = ::curl_easy_perform(curl);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if(!statusVar.empty())
    {
    std::ostringstream result;
    result << (int)res << ";\"" << ::curl_easy_strerror(res) << "\"";
    this->Makefile->AddDefinition(statusVar,
                                  result.str().c_str());
    }

  ::curl_global_cleanup();

  // Explicitly flush/close so we can measure the md5 accurately.
  //
  fout.flush();
  fout.close();

  // Verify MD5 sum if requested:
  //
  if (hash.get())
    {
    std::string actualHash = hash->HashFile(file);
    if (actualHash.empty())
      {
      this->SetError("DOWNLOAD cannot compute hash on downloaded file");
      return false;
      }

    if (expectedHash != actualHash)
      {
      std::ostringstream oss;
      oss << "DOWNLOAD HASH mismatch" << std::endl
        << "  for file: [" << file << "]" << std::endl
        << "    expected hash: [" << expectedHash << "]" << std::endl
        << "      actual hash: [" << actualHash << "]" << std::endl
        << "           status: [" << (int)res << ";\""
          << ::curl_easy_strerror(res) << "\"]" << std::endl
        ;
      this->SetError(oss.str());
      return false;
      }
    }

  if (!logVar.empty())
    {
    chunkDebug.push_back(0);
    this->Makefile->AddDefinition(logVar, &*chunkDebug.begin());
    }

  return true;
#else
  this->SetError("DOWNLOAD not supported by bootstrap cmake.");
  return false;
#endif
}